

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

archive_entry * archive_entry_partial_links(archive_entry_linkresolver *res,uint *links)

{
  links_entry *plVar1;
  uint *in_RSI;
  long in_RDI;
  links_entry *le;
  archive_entry *e;
  undefined8 in_stack_ffffffffffffffe0;
  int mode;
  archive_entry_linkresolver *in_stack_ffffffffffffffe8;
  archive_entry *paVar2;
  
  mode = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if (*(long *)(in_RDI + 8) != 0) {
    archive_entry_free((archive_entry *)0x11737c);
    archive_entry_free((archive_entry *)0x11738e);
    free(*(void **)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  plVar1 = next_entry(in_stack_ffffffffffffffe8,mode);
  if (plVar1 == (links_entry *)0x0) {
    paVar2 = (archive_entry *)0x0;
    if (in_RSI != (uint *)0x0) {
      *in_RSI = 0;
    }
  }
  else {
    paVar2 = plVar1->canonical;
    if (in_RSI != (uint *)0x0) {
      *in_RSI = plVar1->links;
    }
    plVar1->canonical = (archive_entry *)0x0;
  }
  return paVar2;
}

Assistant:

struct archive_entry *
archive_entry_partial_links(struct archive_entry_linkresolver *res,
    unsigned int *links)
{
	struct archive_entry	*e;
	struct links_entry	*le;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	le = next_entry(res, NEXT_ENTRY_PARTIAL);
	if (le != NULL) {
		e = le->canonical;
		if (links != NULL)
			*links = le->links;
		le->canonical = NULL;
	} else {
		e = NULL;
		if (links != NULL)
			*links = 0;
	}
	return (e);
}